

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O2

void __thiscall audiofft::OouraFFT::cftfsub(OouraFFT *this,int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int l;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (n < 9) {
    l = 2;
  }
  else {
    cft1st(this,n,a,w);
    l = 8;
    while( true ) {
      if (n <= l * 4) break;
      cftmdl(this,n,l,a,w);
      l = l * 4;
    }
  }
  lVar3 = (long)l;
  if (l * 4 == n) {
    for (lVar4 = 0; lVar4 < lVar3; lVar4 = lVar4 + 2) {
      dVar5 = a[lVar3];
      dVar6 = (a + lVar3)[1];
      dVar7 = *a - dVar5;
      dVar8 = a[1] - dVar6;
      dVar9 = a[lVar3 * 2];
      dVar10 = (a + lVar3 * 2)[1];
      dVar1 = a[lVar3 * 3];
      dVar2 = (a + lVar3 * 3)[1];
      dVar11 = dVar9 - dVar1;
      dVar12 = dVar10 - dVar2;
      dVar5 = *a + dVar5;
      dVar6 = a[1] + dVar6;
      dVar9 = dVar9 + dVar1;
      dVar10 = dVar10 + dVar2;
      *a = dVar5 + dVar9;
      a[1] = dVar6 + dVar10;
      a[lVar3 * 2] = dVar5 - dVar9;
      (a + lVar3 * 2)[1] = dVar6 - dVar10;
      a[lVar3] = dVar7 - dVar12;
      (a + lVar3)[1] = dVar11 + dVar8;
      a[lVar3 * 3] = dVar12 + dVar7;
      (a + lVar3 * 3)[1] = dVar8 - dVar11;
      a = a + 2;
    }
  }
  else {
    for (lVar4 = 0; lVar4 < lVar3; lVar4 = lVar4 + 2) {
      dVar5 = a[lVar4];
      dVar6 = (a + lVar4)[1];
      dVar9 = a[lVar3 + lVar4];
      dVar10 = (a + lVar3 + lVar4)[1];
      a[lVar4] = dVar9 + dVar5;
      a[lVar4 + 1] = dVar6 + a[lVar3 + lVar4 + 1];
      a[lVar3 + lVar4] = dVar5 - dVar9;
      (a + lVar3 + lVar4)[1] = dVar6 - dVar10;
    }
  }
  return;
}

Assistant:

void cftfsub(int n, double *a, double *w)
        {
          int j, j1, j2, j3, l;
          double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

          l = 2;
          if (n > 8) {
            cft1st(n, a, w);
            l = 8;
            while ((l << 2) < n) {
              cftmdl(n, l, a, w);
              l <<= 2;
            }
          }
          if ((l << 2) == n) {
            for (j = 0; j < l; j += 2) {
              j1 = j + l;
              j2 = j1 + l;
              j3 = j2 + l;
              x0r = a[j] + a[j1];
              x0i = a[j + 1] + a[j1 + 1];
              x1r = a[j] - a[j1];
              x1i = a[j + 1] - a[j1 + 1];
              x2r = a[j2] + a[j3];
              x2i = a[j2 + 1] + a[j3 + 1];
              x3r = a[j2] - a[j3];
              x3i = a[j2 + 1] - a[j3 + 1];
              a[j] = x0r + x2r;
              a[j + 1] = x0i + x2i;
              a[j2] = x0r - x2r;
              a[j2 + 1] = x0i - x2i;
              a[j1] = x1r - x3i;
              a[j1 + 1] = x1i + x3r;
              a[j3] = x1r + x3i;
              a[j3 + 1] = x1i - x3r;
            }
          } else {
            for (j = 0; j < l; j += 2) {
              j1 = j + l;
              x0r = a[j] - a[j1];
              x0i = a[j + 1] - a[j1 + 1];
              a[j] += a[j1];
              a[j + 1] += a[j1 + 1];
              a[j1] = x0r;
              a[j1 + 1] = x0i;
            }
          }
        }